

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reachability_graph.hh
# Opt level: O0

void __thiscall
tchecker::graph::reachability::
graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>
::clear(graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>
        *this)

{
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_20;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true>
  local_18;
  graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>
  *local_10;
  graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>
  *this_local;
  
  local_10 = this;
  local_18._M_cur =
       (__node_type *)
       graph::find::
       graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::reachability::graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>::node_sptr_hash_t,_tchecker::graph::reachability::graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>::node_sptr_equal_to_t>
       ::begin(&this->_find_graph);
  local_20._M_cur =
       (__node_type *)
       graph::find::
       graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::reachability::graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>::node_sptr_hash_t,_tchecker::graph::reachability::graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>::node_sptr_equal_to_t>
       ::end(&this->_find_graph);
  directed::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>>
  ::
  clear<std::__detail::_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,true,true>,std::__detail::_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,true,true>>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>>
              *)&this->field_0x50,
             (_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
              *)&local_18,
             (_Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
              *)&local_20);
  graph::find::
  graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::reachability::graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>::node_sptr_hash_t,_tchecker::graph::reachability::graph_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t,_tchecker::tck_reach::zg_reach::node_hash_t,_tchecker::tck_reach::zg_reach::node_equal_to_t>::node_sptr_equal_to_t>
  ::clear(&this->_find_graph);
  node_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
  ::destruct_all(&this->_node_pool);
  edge_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
  ::destruct_all(&this->_edge_pool);
  return;
}

Assistant:

void clear()
  {
    _directed_graph.clear(_find_graph.begin(), _find_graph.end());
    _find_graph.clear();
    _node_pool.destruct_all();
    _edge_pool.destruct_all();
  }